

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingLayeredCase::iterate
          (ImageBindingLayeredCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  int ndx;
  GLuint unit;
  allocator<char> local_da;
  allocator<char> local_d9;
  ScopedLogSection section;
  CallLogWrapper gl;
  int maxImages;
  Texture textureA;
  Texture textureB;
  ResultCollector result;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textureA," // ERROR: ",(allocator<char> *)&textureB);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&textureA);
  std::__cxx11::string::~string((string *)&textureA);
  maxImages = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8f38,&maxImages);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x272);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&textureA,"Initial",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&textureB,"Initial value",&local_da);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&textureA,(string *)&textureB);
  std::__cxx11::string::~string((string *)&textureB);
  std::__cxx11::string::~string((string *)&textureA);
  for (iVar2 = 0; iVar2 < maxImages; iVar2 = iVar2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
              (&result,&gl,0x8f3c,iVar2,false,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&textureA,"AfterSetting",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&textureB,"After setting",&local_da);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&textureA,(string *)&textureB);
  std::__cxx11::string::~string((string *)&textureB);
  std::__cxx11::string::~string((string *)&textureA);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&textureA,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&textureB,((this->super_TestCase).m_context)->m_renderCtx);
  unit = maxImages / 2;
  glu::CallLogWrapper::glBindTexture(&gl,0xde1,textureA.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexStorage2D(&gl,0xde1,1,0x8058,0x20,0x20);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x284);
  glu::CallLogWrapper::glBindImageTexture
            (&gl,0,textureA.super_ObjectWrapper.m_object,0,'\0',0,35000,0x8d7c);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"bind unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x287);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,textureB.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexStorage3D(&gl,0x8c1a,1,0x8058,0x20,0x20,4);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x28b);
  glu::CallLogWrapper::glBindImageTexture
            (&gl,unit,textureB.super_ObjectWrapper.m_object,0,'\x01',2,35000,0x8d7c);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"bind unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x28e);
  deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
            (&result,&gl,0x8f3c,0,false,this->m_verifierType);
  deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
            (&result,&gl,0x8f3c,unit,true,this->m_verifierType);
  glu::ObjectWrapper::~ObjectWrapper(&textureB.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&textureA.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

ImageBindingLayeredCase::IterateResult ImageBindingLayeredCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxImages	= -1;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_IMAGE_UNITS, &maxImages);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxImages; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_IMAGE_BINDING_LAYERED, ndx, false, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSetting", "After setting");
		glu::Texture				textureA		(m_context.getRenderContext());
		glu::Texture				textureB		(m_context.getRenderContext());
		const int					ndxA			= 0;
		const int					ndxB			= maxImages / 2;

		gl.glBindTexture(GL_TEXTURE_2D, *textureA);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen tex");

		gl.glBindImageTexture(ndxA, *textureA, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8UI);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind unit");

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *textureB);
		gl.glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 32, 32, 4);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen tex");

		gl.glBindImageTexture(ndxB, *textureB, 0, GL_TRUE, 2, GL_READ_ONLY, GL_RGBA8UI);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind unit");

		verifyStateIndexedBoolean(result, gl, GL_IMAGE_BINDING_LAYERED, ndxA, false, m_verifierType);
		verifyStateIndexedBoolean(result, gl, GL_IMAGE_BINDING_LAYERED, ndxB, true, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}